

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void update_stats(AV1_COMMON *cm,ThreadData_conflict *td)

{
  BLOCK_SIZE bsize_00;
  PLANE_TYPE PVar1;
  char cVar2;
  PREDICTION_MODE PVar3;
  MACROBLOCKD *mbmi_00;
  long lVar4;
  byte bVar5;
  byte bVar6;
  int16_t iVar7;
  int iVar8;
  int iVar9;
  MACROBLOCKD *pMVar10;
  aom_cdf_prob *paVar11;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int_mv ref_mv_2;
  int ref_2;
  int_mv ref_mv_1;
  int ref_1;
  int_mv ref_mv;
  int ref;
  int allow_hp;
  uint8_t drl_ctx_1;
  int idx_1;
  uint8_t ref_frame_type_2;
  uint8_t drl_ctx;
  int idx;
  uint8_t ref_frame_type_1;
  int new_mv;
  int16_t mode_ctx;
  PREDICTION_MODE mode;
  int comp_index_ctx;
  int comp_group_idx_ctx;
  int masked_compound_used;
  MOTION_MODE motion_allowed;
  int bsize_group;
  int bit1_1;
  int bit_2;
  int bit_1;
  int bit1;
  int bit;
  COMP_REFERENCE_TYPE comp_ref_type;
  MV_REFERENCE_FRAME ref1;
  MV_REFERENCE_FRAME ref0;
  int inter_block;
  FRAME_COUNTS *counts;
  int_mv dv_ref;
  int8_t ref_frame_type;
  int is_intrabc;
  int skip_ctx;
  int skip_mode_ctx;
  int seg_ref_active;
  FRAME_CONTEXT *fc;
  BLOCK_SIZE bsize;
  CurrentFrame *current_frame;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  MvSubpelPrecision precision;
  undefined2 in_stack_fffffffffffffed0;
  BLOCK_SIZE in_stack_fffffffffffffed2;
  BLOCK_SIZE in_stack_fffffffffffffed3;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar12;
  undefined2 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee6;
  bool bVar13;
  undefined1 uVar14;
  undefined1 in_stack_fffffffffffffee7;
  uint in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  MB_MODE_INFO *in_stack_fffffffffffffef8;
  AV1_COMMON *above_mi;
  MB_MODE_INFO *mbmi_01;
  MACROBLOCKD *in_stack_ffffffffffffff18;
  AV1_COMMON *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff30;
  int local_bc;
  int local_b0;
  uint local_a8;
  
  pMVar10 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  mbmi_00 = (MACROBLOCKD *)**(undefined8 **)(in_RSI + 0x2058);
  bsize_00 = *(BLOCK_SIZE *)&mbmi_00->mi_row;
  lVar4 = *(long *)(in_RSI + 0x2b38);
  iVar8 = segfeature_active(&in_RDI->seg,
                            (byte)*(undefined2 *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) &
                            7,'\x05');
  if ((((in_RDI->current_frame).skip_mode_info.skip_mode_flag != 0) && (iVar8 == 0)) &&
     (iVar9 = is_comp_ref_allowed(bsize_00), iVar9 != 0)) {
    iVar9 = av1_get_skip_mode_context(pMVar10);
    update_cdf((aom_cdf_prob *)(lVar4 + 0x2e4c + (long)iVar9 * 6),
               (byte)(*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 6) & 1,2);
  }
  if (((*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 6 & 1) == 0) && (iVar8 == 0))
  {
    iVar9 = av1_get_skip_txfm_context(pMVar10);
    update_cdf((aom_cdf_prob *)(lVar4 + 0x2e5e + (long)iVar9 * 6),
               (uint8_t)mbmi_00->plane[0].seg_dequant_QTX[0][0],2);
  }
  iVar9 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_fffffffffffffed4,
                                  CONCAT13(in_stack_fffffffffffffed3,
                                           CONCAT12(in_stack_fffffffffffffed2,
                                                    in_stack_fffffffffffffed0))));
  if (iVar9 == 0) {
    mbmi_01 = *(MB_MODE_INFO **)(in_RSI + 0x25c58);
    in_stack_ffffffffffffff20 = *(AV1_COMMON **)(in_RSI + 0x2070);
    above_mi = in_RDI;
    in_stack_ffffffffffffff18 = mbmi_00;
    in_stack_fffffffffffffec8 = frame_is_intra_only(in_RDI);
    av1_sum_intra_stats(in_stack_ffffffffffffff20,(FRAME_COUNTS *)in_stack_ffffffffffffff18,pMVar10,
                        mbmi_01,(MB_MODE_INFO *)above_mi,in_stack_fffffffffffffef8,
                        in_stack_ffffffffffffff30);
  }
  iVar9 = av1_allow_intrabc((AV1_COMMON *)
                            CONCAT44(in_stack_fffffffffffffed4,
                                     CONCAT13(in_stack_fffffffffffffed3,
                                              CONCAT12(in_stack_fffffffffffffed2,
                                                       in_stack_fffffffffffffed0))));
  if (iVar9 != 0) {
    iVar9 = is_intrabc_block((MB_MODE_INFO *)mbmi_00);
    update_cdf((aom_cdf_prob *)(lVar4 + 0x30c4),(int8_t)iVar9,2);
    if (iVar9 != 0) {
      av1_ref_frame_type((MV_REFERENCE_FRAME *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      av1_update_mv_stats((MV *)CONCAT17(in_stack_fffffffffffffee7,
                                         CONCAT16(in_stack_fffffffffffffee6,
                                                  CONCAT24(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0))),
                          (MV *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (nmv_context *)
                          CONCAT44(in_stack_fffffffffffffed4,
                                   CONCAT13(in_stack_fffffffffffffed3,
                                            CONCAT12(in_stack_fffffffffffffed2,
                                                     in_stack_fffffffffffffed0))),
                          (MvSubpelPrecision)((uint)in_stack_fffffffffffffecc >> 0x18));
    }
  }
  iVar9 = frame_is_intra_only(in_RDI);
  if ((iVar9 == 0) && ((*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 6 & 1) == 0))
  {
    iVar9 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_fffffffffffffed4,
                                    CONCAT13(in_stack_fffffffffffffed3,
                                             CONCAT12(in_stack_fffffffffffffed2,
                                                      in_stack_fffffffffffffed0))));
    if (iVar8 == 0) {
      pMVar10 = (MACROBLOCKD *)(lVar4 + 0x2e70);
      iVar8 = av1_get_intra_inter_context(pMVar10);
      update_cdf((aom_cdf_prob *)((long)(pMVar10->plane[0].pre + -2) + (long)iVar8 * 6),
                 (int8_t)iVar9,2);
      if (iVar9 != 0) {
        PVar1 = mbmi_00->plane[0].plane_type;
        cVar2 = mbmi_00->plane[0].field_0x1;
        if (((in_RDI->current_frame).reference_mode == '\x02') &&
           (iVar8 = is_comp_ref_allowed(bsize_00), iVar8 != 0)) {
          paVar11 = av1_get_reference_mode_cdf
                              ((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffed4,
                                        CONCAT13(in_stack_fffffffffffffed3,
                                                 CONCAT12(in_stack_fffffffffffffed2,
                                                          in_stack_fffffffffffffed0))));
          iVar8 = has_second_ref((MB_MODE_INFO *)mbmi_00);
          update_cdf(paVar11,(int8_t)iVar8,2);
        }
        iVar8 = has_second_ref((MB_MODE_INFO *)mbmi_00);
        if (iVar8 == 0) {
          paVar11 = av1_get_pred_cdf_single_ref_p1
                              ((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffed4,
                                        CONCAT13(in_stack_fffffffffffffed3,
                                                 CONCAT12(in_stack_fffffffffffffed2,
                                                          in_stack_fffffffffffffed0))));
          update_cdf(paVar11,'\x04' < (char)PVar1,2);
          if ('\x04' < (char)PVar1) {
            paVar11 = av1_get_pred_cdf_single_ref_p2
                                ((MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffed4,
                                          CONCAT13(in_stack_fffffffffffffed3,
                                                   CONCAT12(in_stack_fffffffffffffed2,
                                                            in_stack_fffffffffffffed0))));
            update_cdf(paVar11,PVar1 == '\a',2);
            if (PVar1 != '\a') {
              paVar11 = av1_get_pred_cdf_single_ref_p6
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,PVar1 == '\x06',2);
            }
          }
          else {
            in_stack_fffffffffffffeed = PVar1 == '\x02' || PVar1 == '\x01';
            bVar5 = (in_stack_fffffffffffffeed ^ 0xff) & 1;
            paVar11 = av1_get_pred_cdf_single_ref_p3
                                ((MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffed4,
                                          CONCAT13(in_stack_fffffffffffffed3,
                                                   CONCAT12(in_stack_fffffffffffffed2,
                                                            in_stack_fffffffffffffed0))));
            update_cdf(paVar11,bVar5,2);
            if (bVar5 == 0) {
              paVar11 = av1_get_pred_cdf_single_ref_p4
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,PVar1 != '\x01',2);
            }
            else {
              paVar11 = av1_get_pred_cdf_single_ref_p5
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,PVar1 != '\x03',2);
            }
          }
        }
        else {
          iVar8 = has_uni_comp_refs((MB_MODE_INFO *)
                                    CONCAT44(in_stack_fffffffffffffed4,
                                             CONCAT13(in_stack_fffffffffffffed3,
                                                      CONCAT12(in_stack_fffffffffffffed2,
                                                               in_stack_fffffffffffffed0))));
          paVar11 = av1_get_comp_reference_type_cdf
                              ((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffed4,
                                        CONCAT13(in_stack_fffffffffffffed3,
                                                 CONCAT12(in_stack_fffffffffffffed2,
                                                          in_stack_fffffffffffffed0))));
          update_cdf(paVar11,iVar8 == 0,2);
          if (iVar8 == 0) {
            bVar13 = PVar1 == '\x04' || PVar1 == '\x03';
            in_stack_fffffffffffffeee = bVar13;
            paVar11 = av1_get_pred_cdf_comp_ref_p
                                ((MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffed4,
                                          CONCAT13(in_stack_fffffffffffffed3,
                                                   CONCAT12(in_stack_fffffffffffffed2,
                                                            in_stack_fffffffffffffed0))));
            update_cdf(paVar11,bVar13,2);
            if (bVar13) {
              paVar11 = av1_get_pred_cdf_comp_ref_p2
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,PVar1 == '\x04',2);
            }
            else {
              paVar11 = av1_get_pred_cdf_comp_ref_p1
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,PVar1 == '\x02',2);
            }
            paVar11 = av1_get_pred_cdf_comp_bwdref_p
                                ((MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffed4,
                                          CONCAT13(in_stack_fffffffffffffed3,
                                                   CONCAT12(in_stack_fffffffffffffed2,
                                                            in_stack_fffffffffffffed0))));
            update_cdf(paVar11,cVar2 == '\a',2);
            if (cVar2 != '\a') {
              paVar11 = av1_get_pred_cdf_comp_bwdref_p1
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,cVar2 == '\x06',2);
            }
          }
          else {
            paVar11 = av1_get_pred_cdf_uni_comp_ref_p
                                ((MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffed4,
                                          CONCAT13(in_stack_fffffffffffffed3,
                                                   CONCAT12(in_stack_fffffffffffffed2,
                                                            in_stack_fffffffffffffed0))));
            update_cdf(paVar11,PVar1 == '\x05',2);
            if (PVar1 != '\x05') {
              bVar13 = cVar2 == '\x03' || cVar2 == '\x04';
              in_stack_fffffffffffffeef = bVar13;
              paVar11 = av1_get_pred_cdf_uni_comp_ref_p1
                                  ((MACROBLOCKD *)
                                   CONCAT44(in_stack_fffffffffffffed4,
                                            CONCAT13(in_stack_fffffffffffffed3,
                                                     CONCAT12(in_stack_fffffffffffffed2,
                                                              in_stack_fffffffffffffed0))));
              update_cdf(paVar11,bVar13,2);
              if (bVar13) {
                paVar11 = av1_get_pred_cdf_uni_comp_ref_p2
                                    ((MACROBLOCKD *)
                                     CONCAT44(in_stack_fffffffffffffed4,
                                              CONCAT13(in_stack_fffffffffffffed3,
                                                       CONCAT12(in_stack_fffffffffffffed2,
                                                                in_stack_fffffffffffffed0))));
                update_cdf(paVar11,cVar2 == '\x04',2);
              }
            }
          }
        }
        if ((in_RDI->seq_params->enable_interintra_compound != '\0') &&
           (iVar8 = is_interintra_allowed
                              ((MB_MODE_INFO *)
                               CONCAT44(in_stack_fffffffffffffed4,
                                        CONCAT13(in_stack_fffffffffffffed3,
                                                 CONCAT12(in_stack_fffffffffffffed2,
                                                          in_stack_fffffffffffffed0)))), iVar8 != 0)
           ) {
          uVar12 = (uint)""[bsize_00];
          if (mbmi_00->plane[0].field_0x1 == '\0') {
            update_cdf((aom_cdf_prob *)(lVar4 + 0x2400 + (long)(int)uVar12 * 6),'\x01',2);
            update_cdf((aom_cdf_prob *)(lVar4 + 0x249c + (long)(int)uVar12 * 10),
                       *(INTERINTRA_MODE *)&mbmi_00->plane[0].pre[0].buf,4);
            iVar8 = av1_is_wedge_used(bsize_00);
            if ((iVar8 != 0) &&
               (update_cdf((aom_cdf_prob *)(lVar4 + 0x2418 + (ulong)bsize_00 * 6),
                           (byte)((ushort)*(undefined2 *)
                                           ((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 10) &
                           1,2),
               (*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 10 & 1) != 0)) {
              update_cdf((aom_cdf_prob *)(lVar4 + 0x2114 + (ulong)bsize_00 * 0x22),
                         *(int8_t *)((long)&mbmi_00->plane[0].pre[0].buf + 1),0x10);
            }
          }
          else {
            update_cdf((aom_cdf_prob *)(lVar4 + 0x2400 + (long)(int)uVar12 * 6),'\0',2);
          }
        }
        if (((in_RDI->features).switchable_motion_mode & 1U) == 0) {
          in_stack_fffffffffffffee8 = 0;
        }
        else {
          bVar5 = motion_mode_allowed((WarpedMotionParams *)
                                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                      (MACROBLOCKD *)
                                      CONCAT44(in_stack_fffffffffffffed4,
                                               CONCAT13(in_stack_fffffffffffffed3,
                                                        CONCAT12(in_stack_fffffffffffffed2,
                                                                 in_stack_fffffffffffffed0))),
                                      (MB_MODE_INFO *)
                                      CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                      0);
          in_stack_fffffffffffffee8 = (uint)bVar5;
        }
        if (mbmi_00->plane[0].field_0x1 != '\0') {
          if ((char)in_stack_fffffffffffffee8 == '\x02') {
            update_cdf((aom_cdf_prob *)(lVar4 + 0x24c4 + (ulong)bsize_00 * 8),
                       (MOTION_MODE)mbmi_00->plane[0].subsampling_y,3);
          }
          else if ((char)in_stack_fffffffffffffee8 == '\x01') {
            update_cdf((aom_cdf_prob *)(lVar4 + 0x2574 + (ulong)bsize_00 * 6),
                       (MOTION_MODE)mbmi_00->plane[0].subsampling_y == '\x01',2);
          }
        }
        iVar8 = has_second_ref((MB_MODE_INFO *)mbmi_00);
        if (iVar8 != 0) {
          iVar8 = is_any_masked_compound_used(in_stack_fffffffffffffed3);
          in_stack_fffffffffffffee7 = false;
          if (iVar8 != 0) {
            in_stack_fffffffffffffee7 = in_RDI->seq_params->enable_masked_compound != '\0';
          }
          if ((bool)in_stack_fffffffffffffee7 != false) {
            iVar8 = get_comp_group_idx_context
                              ((MACROBLOCKD *)
                               CONCAT17(in_stack_fffffffffffffee7,
                                        CONCAT16(in_stack_fffffffffffffee6,
                                                 CONCAT24(in_stack_fffffffffffffee4,
                                                          in_stack_fffffffffffffee0))));
            update_cdf((aom_cdf_prob *)(lVar4 + 0x2e28 + (long)iVar8 * 6),
                       (byte)((ushort)*(undefined2 *)
                                       ((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 8) & 1,2)
            ;
          }
          if ((*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) & 0x100) == 0) {
            iVar8 = get_comp_index_context(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            update_cdf((aom_cdf_prob *)(lVar4 + 0x2e04 + (long)iVar8 * 6),
                       (byte)((ushort)*(undefined2 *)
                                       ((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 9) & 1,2)
            ;
          }
          else {
            iVar8 = is_interinter_compound_used(in_stack_fffffffffffffed3,in_stack_fffffffffffffed2)
            ;
            if (iVar8 != 0) {
              update_cdf((aom_cdf_prob *)(lVar4 + 0x2090 + (ulong)bsize_00 * 6),
                         *(COMPOUND_TYPE *)((long)&mbmi_00->plane[0].pre[0].width + 3) + 0xfe,2);
            }
          }
        }
        if ((*(COMPOUND_TYPE *)((long)&mbmi_00->plane[0].pre[0].width + 3) == '\x02') &&
           (iVar8 = is_interinter_compound_used(in_stack_fffffffffffffed3,in_stack_fffffffffffffed2)
           , iVar8 != 0)) {
          update_cdf((aom_cdf_prob *)(lVar4 + 0x2114 + (ulong)bsize_00 * 0x22),
                     (int8_t)mbmi_00->plane[0].pre[0].width,0x10);
        }
      }
    }
    if (((iVar9 != 0) && ((in_RDI->features).interp_filter == MULTITAP_SHARP2)) &&
       (iVar8 = av1_is_interp_needed
                          ((MACROBLOCKD *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
       iVar8 != 0)) {
      update_filter_type_cdf
                ((MACROBLOCKD *)
                 CONCAT17(in_stack_fffffffffffffee7,
                          CONCAT16(in_stack_fffffffffffffee6,
                                   CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))),
                 (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed4);
    }
    if ((iVar9 != 0) &&
       (iVar8 = segfeature_active(&in_RDI->seg,
                                  (byte)*(undefined2 *)
                                         ((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) & 7,'\x06'
                                 ), iVar8 == 0)) {
      PVar3 = *(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2);
      iVar7 = av1_mode_context_analyzer
                        ((int16_t *)
                         CONCAT17(in_stack_fffffffffffffeef,
                                  CONCAT16(in_stack_fffffffffffffeee,
                                           CONCAT15(in_stack_fffffffffffffeed,
                                                    CONCAT14(in_stack_fffffffffffffeec,
                                                             in_stack_fffffffffffffee8)))),
                         (MV_REFERENCE_FRAME *)
                         CONCAT17(in_stack_fffffffffffffee7,
                                  CONCAT16(in_stack_fffffffffffffee6,
                                           CONCAT24(in_stack_fffffffffffffee4,
                                                    in_stack_fffffffffffffee0))));
      iVar8 = has_second_ref((MB_MODE_INFO *)mbmi_00);
      if (iVar8 == 0) {
        av1_update_inter_mode_stats
                  ((FRAME_CONTEXT *)
                   CONCAT44(in_stack_fffffffffffffed4,
                            CONCAT13(in_stack_fffffffffffffed3,
                                     CONCAT12(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0)))
                   ,(FRAME_COUNTS *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   '\0',0);
      }
      else {
        update_cdf((aom_cdf_prob *)(lVar4 + 0x2000 + (long)iVar7 * 0x12),PVar3 + 0xef,8);
      }
      bVar13 = true;
      if (*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) != '\x10') {
        bVar13 = *(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) == '\x18';
      }
      uVar14 = bVar13;
      if (bVar13 != false) {
        bVar5 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        for (local_a8 = 0; (int)local_a8 < 2; local_a8 = local_a8 + 1) {
          if ((int)(local_a8 + 1) < (int)(uint)*(byte *)(in_RSI + 0x40f8 + (ulong)bVar5)) {
            bVar6 = av1_drl_ctx((uint16_t *)(in_RSI + 0x4010 + (ulong)bVar5 * 8),local_a8);
            update_cdf((aom_cdf_prob *)(lVar4 + 0x1fee + (ulong)bVar6 * 6),
                       ((byte)(*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 4) & 3
                       ) != local_a8,2);
            if (((byte)(*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 4) & 3) ==
                local_a8) break;
          }
        }
      }
      iVar8 = have_nearmv_in_inter_mode(*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2));
      if (iVar8 != 0) {
        bVar5 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        for (local_b0 = 1; local_b0 < 3; local_b0 = local_b0 + 1) {
          if (local_b0 + 1 < (int)(uint)*(byte *)(in_RSI + 0x40f8 + (ulong)bVar5)) {
            bVar6 = av1_drl_ctx((uint16_t *)(in_RSI + 0x4010 + (ulong)bVar5 * 8),local_b0);
            update_cdf((aom_cdf_prob *)(lVar4 + 0x1fee + (ulong)bVar6 * 6),
                       (uint)((byte)(*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >>
                                    4) & 3) != local_b0 - 1U,2);
            if ((uint)((byte)(*(ushort *)((long)mbmi_00->plane[0].seg_dequant_QTX[5] + 3) >> 4) & 3)
                == local_b0 - 1U) break;
          }
        }
      }
      iVar8 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2));
      precision = (MvSubpelPrecision)((uint)in_stack_fffffffffffffecc >> 0x18);
      if (iVar8 != 0) {
        if (((in_RDI->features).cur_frame_force_integer_mv & 1U) == 0) {
          uVar12 = (uint)((in_RDI->features).allow_high_precision_mv & 1);
        }
        else {
          uVar12 = 0xffffffff;
        }
        if (bVar13 == false) {
          if ((*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) == '\x13') ||
             (*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) == '\x15')) {
            av1_get_ref_mv((MACROBLOCK *)
                           CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,
                                             CONCAT15(in_stack_fffffffffffffeed,
                                                      CONCAT14(in_stack_fffffffffffffeec,
                                                               in_stack_fffffffffffffee8)))),
                           CONCAT13(in_stack_fffffffffffffee7,
                                    CONCAT12(uVar14,in_stack_fffffffffffffee4)));
            av1_update_mv_stats((MV *)CONCAT17(in_stack_fffffffffffffee7,
                                               CONCAT16(uVar14,CONCAT24(in_stack_fffffffffffffee4,
                                                                        uVar12))),
                                (MV *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                (nmv_context *)
                                CONCAT44(in_stack_fffffffffffffed4,
                                         CONCAT13(in_stack_fffffffffffffed3,
                                                  CONCAT12(in_stack_fffffffffffffed2,
                                                           in_stack_fffffffffffffed0))),precision);
          }
          else if ((*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) == '\x14') ||
                  (*(PREDICTION_MODE *)((long)&mbmi_00->mi_row + 2) == '\x16')) {
            av1_get_ref_mv((MACROBLOCK *)
                           CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,
                                             CONCAT15(in_stack_fffffffffffffeed,
                                                      CONCAT14(in_stack_fffffffffffffeec,
                                                               in_stack_fffffffffffffee8)))),
                           CONCAT13(in_stack_fffffffffffffee7,
                                    CONCAT12(uVar14,in_stack_fffffffffffffee4)));
            av1_update_mv_stats((MV *)CONCAT17(in_stack_fffffffffffffee7,
                                               CONCAT16(uVar14,CONCAT24(in_stack_fffffffffffffee4,
                                                                        uVar12))),
                                (MV *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                (nmv_context *)
                                CONCAT44(in_stack_fffffffffffffed4,
                                         CONCAT13(in_stack_fffffffffffffed3,
                                                  CONCAT12(in_stack_fffffffffffffed2,
                                                           in_stack_fffffffffffffed0))),precision);
          }
        }
        else {
          local_bc = 0;
          while (iVar8 = local_bc, iVar9 = has_second_ref((MB_MODE_INFO *)mbmi_00),
                iVar8 < iVar9 + 1) {
            av1_get_ref_mv((MACROBLOCK *)
                           CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,
                                             CONCAT15(in_stack_fffffffffffffeed,
                                                      CONCAT14(in_stack_fffffffffffffeec,
                                                               in_stack_fffffffffffffee8)))),
                           CONCAT13(in_stack_fffffffffffffee7,
                                    CONCAT12(uVar14,in_stack_fffffffffffffee4)));
            av1_update_mv_stats((MV *)CONCAT17(in_stack_fffffffffffffee7,
                                               CONCAT16(uVar14,CONCAT24(in_stack_fffffffffffffee4,
                                                                        uVar12))),
                                (MV *)CONCAT44(iVar8,in_stack_fffffffffffffed8),
                                (nmv_context *)
                                CONCAT44(in_stack_fffffffffffffed4,
                                         CONCAT13(in_stack_fffffffffffffed3,
                                                  CONCAT12(in_stack_fffffffffffffed2,
                                                           in_stack_fffffffffffffed0))),
                                (MvSubpelPrecision)((uint)in_stack_fffffffffffffecc >> 0x18));
            local_bc = local_bc + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void update_stats(const AV1_COMMON *const cm, ThreadData *td) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const CurrentFrame *const current_frame = &cm->current_frame;
  const BLOCK_SIZE bsize = mbmi->bsize;
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const int seg_ref_active =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);

  if (current_frame->skip_mode_info.skip_mode_flag && !seg_ref_active &&
      is_comp_ref_allowed(bsize)) {
    const int skip_mode_ctx = av1_get_skip_mode_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_mode[skip_mode_ctx][mbmi->skip_mode]++;
#endif
    update_cdf(fc->skip_mode_cdfs[skip_mode_ctx], mbmi->skip_mode, 2);
  }

  if (!mbmi->skip_mode && !seg_ref_active) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_txfm[skip_ctx][mbmi->skip_txfm]++;
#endif
    update_cdf(fc->skip_txfm_cdfs[skip_ctx], mbmi->skip_txfm, 2);
  }

#if CONFIG_ENTROPY_STATS
  // delta quant applies to both intra and inter
  const int super_block_upper_left =
      ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
      ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  if (delta_q_info->delta_q_present_flag &&
      (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
      super_block_upper_left) {
    const int dq = (mbmi->current_qindex - xd->current_base_qindex) /
                   delta_q_info->delta_q_res;
    const int absdq = abs(dq);
    for (int i = 0; i < AOMMIN(absdq, DELTA_Q_SMALL); ++i) {
      td->counts->delta_q[i][1]++;
    }
    if (absdq < DELTA_Q_SMALL) td->counts->delta_q[absdq][0]++;
    if (delta_q_info->delta_lf_present_flag) {
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int delta_lf = (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                               delta_q_info->delta_lf_res;
          const int abs_delta_lf = abs(delta_lf);
          for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
            td->counts->delta_lf_multi[lf_id][i][1]++;
          }
          if (abs_delta_lf < DELTA_LF_SMALL)
            td->counts->delta_lf_multi[lf_id][abs_delta_lf][0]++;
        }
      } else {
        const int delta_lf =
            (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
            delta_q_info->delta_lf_res;
        const int abs_delta_lf = abs(delta_lf);
        for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
          td->counts->delta_lf[i][1]++;
        }
        if (abs_delta_lf < DELTA_LF_SMALL)
          td->counts->delta_lf[abs_delta_lf][0]++;
      }
    }
  }
#endif

  if (!is_inter_block(mbmi)) {
    av1_sum_intra_stats(cm, td->counts, xd, mbmi, xd->above_mbmi, xd->left_mbmi,
                        frame_is_intra_only(cm));
  }

  if (av1_allow_intrabc(cm)) {
    const int is_intrabc = is_intrabc_block(mbmi);
    update_cdf(fc->intrabc_cdf, is_intrabc, 2);
#if CONFIG_ENTROPY_STATS
    ++td->counts->intrabc[is_intrabc];
#endif  // CONFIG_ENTROPY_STATS
    if (is_intrabc) {
      const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      const int_mv dv_ref = mbmi_ext->ref_mv_stack[ref_frame_type][0].this_mv;
      av1_update_mv_stats(&mbmi->mv[0].as_mv, &dv_ref.as_mv, &fc->ndvc,
                          MV_SUBPEL_NONE);
    }
  }

  if (frame_is_intra_only(cm) || mbmi->skip_mode) return;

  FRAME_COUNTS *const counts = td->counts;
  const int inter_block = is_inter_block(mbmi);

  if (!seg_ref_active) {
#if CONFIG_ENTROPY_STATS
    counts->intra_inter[av1_get_intra_inter_context(xd)][inter_block]++;
#endif
    update_cdf(fc->intra_inter_cdf[av1_get_intra_inter_context(xd)],
               inter_block, 2);
    // If the segment reference feature is enabled we have only a single
    // reference frame allowed for the segment so exclude it from
    // the reference frame counts used to work out probabilities.
    if (inter_block) {
      const MV_REFERENCE_FRAME ref0 = mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME ref1 = mbmi->ref_frame[1];
      if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
        if (is_comp_ref_allowed(bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->comp_inter[av1_get_reference_mode_context(xd)]
                            [has_second_ref(mbmi)]++;
#endif  // CONFIG_ENTROPY_STATS
          update_cdf(av1_get_reference_mode_cdf(xd), has_second_ref(mbmi), 2);
        }
      }

      if (has_second_ref(mbmi)) {
        const COMP_REFERENCE_TYPE comp_ref_type = has_uni_comp_refs(mbmi)
                                                      ? UNIDIR_COMP_REFERENCE
                                                      : BIDIR_COMP_REFERENCE;
        update_cdf(av1_get_comp_reference_type_cdf(xd), comp_ref_type,
                   COMP_REFERENCE_TYPES);
#if CONFIG_ENTROPY_STATS
        counts->comp_ref_type[av1_get_comp_reference_type_context(xd)]
                             [comp_ref_type]++;
#endif  // CONFIG_ENTROPY_STATS

        if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
          const int bit = (ref0 == BWDREF_FRAME);
          update_cdf(av1_get_pred_cdf_uni_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts
              ->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            const int bit1 = (ref1 == LAST3_FRAME || ref1 == GOLDEN_FRAME);
            update_cdf(av1_get_pred_cdf_uni_comp_ref_p1(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
            counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p1(xd)][1]
                                [bit1]++;
#endif  // CONFIG_ENTROPY_STATS
            if (bit1) {
              update_cdf(av1_get_pred_cdf_uni_comp_ref_p2(xd),
                         ref1 == GOLDEN_FRAME, 2);
#if CONFIG_ENTROPY_STATS
              counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p2(xd)][2]
                                  [ref1 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
            }
          }
        } else {
          const int bit = (ref0 == GOLDEN_FRAME || ref0 == LAST3_FRAME);
          update_cdf(av1_get_pred_cdf_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts->comp_ref[av1_get_pred_context_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            update_cdf(av1_get_pred_cdf_comp_ref_p1(xd), ref0 == LAST2_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p1(xd)][1]
                            [ref0 == LAST2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_comp_ref_p2(xd), ref0 == GOLDEN_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p2(xd)][2]
                            [ref0 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
          update_cdf(av1_get_pred_cdf_comp_bwdref_p(xd), ref1 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p(xd)][0]
                             [ref1 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref1 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_comp_bwdref_p1(xd),
                       ref1 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p1(xd)][1]
                               [ref1 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      } else {
        const int bit = (ref0 >= BWDREF_FRAME);
        update_cdf(av1_get_pred_cdf_single_ref_p1(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
        counts->single_ref[av1_get_pred_context_single_ref_p1(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
        if (bit) {
          assert(ref0 <= ALTREF_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p2(xd), ref0 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p2(xd)][1]
                            [ref0 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref0 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_single_ref_p6(xd),
                       ref0 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p6(xd)][5]
                              [ref0 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        } else {
          const int bit1 = !(ref0 == LAST2_FRAME || ref0 == LAST_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p3(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p3(xd)][2][bit1]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit1) {
            update_cdf(av1_get_pred_cdf_single_ref_p4(xd), ref0 != LAST_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p4(xd)][3]
                              [ref0 != LAST_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_single_ref_p5(xd), ref0 != LAST3_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p5(xd)][4]
                              [ref0 != LAST3_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      }

      if (cm->seq_params->enable_interintra_compound &&
          is_interintra_allowed(mbmi)) {
        const int bsize_group = size_group_lookup[bsize];
        if (mbmi->ref_frame[1] == INTRA_FRAME) {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][1]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 1, 2);
#if CONFIG_ENTROPY_STATS
          counts->interintra_mode[bsize_group][mbmi->interintra_mode]++;
#endif
          update_cdf(fc->interintra_mode_cdf[bsize_group],
                     mbmi->interintra_mode, INTERINTRA_MODES);
          if (av1_is_wedge_used(bsize)) {
#if CONFIG_ENTROPY_STATS
            counts->wedge_interintra[bsize][mbmi->use_wedge_interintra]++;
#endif
            update_cdf(fc->wedge_interintra_cdf[bsize],
                       mbmi->use_wedge_interintra, 2);
            if (mbmi->use_wedge_interintra) {
#if CONFIG_ENTROPY_STATS
              counts->wedge_idx[bsize][mbmi->interintra_wedge_index]++;
#endif
              update_cdf(fc->wedge_idx_cdf[bsize], mbmi->interintra_wedge_index,
                         16);
            }
          }
        } else {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][0]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 0, 2);
        }
      }

      const MOTION_MODE motion_allowed =
          cm->features.switchable_motion_mode
              ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                    cm->features.allow_warped_motion)
              : SIMPLE_TRANSLATION;
      if (mbmi->ref_frame[1] != INTRA_FRAME) {
        if (motion_allowed == WARPED_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->motion_mode[bsize][mbmi->motion_mode]++;
#endif
          update_cdf(fc->motion_mode_cdf[bsize], mbmi->motion_mode,
                     MOTION_MODES);
        } else if (motion_allowed == OBMC_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->obmc[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
#endif
          update_cdf(fc->obmc_cdf[bsize], mbmi->motion_mode == OBMC_CAUSAL, 2);
        }
      }

      if (has_second_ref(mbmi)) {
        assert(current_frame->reference_mode != SINGLE_REFERENCE &&
               is_inter_compound_mode(mbmi->mode) &&
               mbmi->motion_mode == SIMPLE_TRANSLATION);

        const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                         cm->seq_params->enable_masked_compound;
        if (masked_compound_used) {
          const int comp_group_idx_ctx = get_comp_group_idx_context(xd);
#if CONFIG_ENTROPY_STATS
          ++counts->comp_group_idx[comp_group_idx_ctx][mbmi->comp_group_idx];
#endif
          update_cdf(fc->comp_group_idx_cdf[comp_group_idx_ctx],
                     mbmi->comp_group_idx, 2);
        }

        if (mbmi->comp_group_idx == 0) {
          const int comp_index_ctx = get_comp_index_context(cm, xd);
#if CONFIG_ENTROPY_STATS
          ++counts->compound_index[comp_index_ctx][mbmi->compound_idx];
#endif
          update_cdf(fc->compound_index_cdf[comp_index_ctx], mbmi->compound_idx,
                     2);
        } else {
          assert(masked_compound_used);
          if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
            ++counts->compound_type[bsize][mbmi->interinter_comp.type -
                                           COMPOUND_WEDGE];
#endif
            update_cdf(fc->compound_type_cdf[bsize],
                       mbmi->interinter_comp.type - COMPOUND_WEDGE,
                       MASKED_COMPOUND_TYPES);
          }
        }
      }
      if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
        if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->wedge_idx[bsize][mbmi->interinter_comp.wedge_index]++;
#endif
          update_cdf(fc->wedge_idx_cdf[bsize],
                     mbmi->interinter_comp.wedge_index, 16);
        }
      }
    }
  }

  if (inter_block && cm->features.interp_filter == SWITCHABLE &&
      av1_is_interp_needed(xd)) {
    update_filter_type_cdf(xd, mbmi, cm->seq_params->enable_dual_filter);
  }
  if (inter_block &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    const PREDICTION_MODE mode = mbmi->mode;
    const int16_t mode_ctx =
        av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);
    if (has_second_ref(mbmi)) {
#if CONFIG_ENTROPY_STATS
      ++counts->inter_compound_mode[mode_ctx][INTER_COMPOUND_OFFSET(mode)];
#endif
      update_cdf(fc->inter_compound_mode_cdf[mode_ctx],
                 INTER_COMPOUND_OFFSET(mode), INTER_COMPOUND_MODES);
    } else {
      av1_update_inter_mode_stats(fc, counts, mode, mode_ctx);
    }

    const int new_mv = mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV;
    if (new_mv) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 0; idx < 2; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx];
#endif
          if (mbmi->ref_mv_idx == idx) break;
        }
      }
    }

    if (have_nearmv_in_inter_mode(mbmi->mode)) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 1; idx < 3; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx - 1, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx - 1];
#endif
          if (mbmi->ref_mv_idx == idx - 1) break;
        }
      }
    }
    if (have_newmv_in_inter_mode(mbmi->mode)) {
      const int allow_hp = cm->features.cur_frame_force_integer_mv
                               ? MV_SUBPEL_NONE
                               : cm->features.allow_high_precision_mv;
      if (new_mv) {
        for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
          const int_mv ref_mv = av1_get_ref_mv(x, ref);
          av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                              allow_hp);
        }
      } else if (mbmi->mode == NEAREST_NEWMV || mbmi->mode == NEAR_NEWMV) {
        const int ref = 1;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      } else if (mbmi->mode == NEW_NEARESTMV || mbmi->mode == NEW_NEARMV) {
        const int ref = 0;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      }
    }
  }
}